

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::FixFuncCallArgumentsPass::FixFuncCallArguments
          (FixFuncCallArgumentsPass *this,Instruction *func_call_inst)

{
  uint32_t uVar1;
  Operand *this_00;
  DefUseManager *this_01;
  Instruction *operand_inst;
  uint32_t i;
  uint32_t index;
  bool bVar2;
  initializer_list<unsigned_int> init_list;
  uint32_t local_5c;
  SmallVector<unsigned_int,_2UL> local_58;
  
  index = 0;
  bVar2 = false;
  while( true ) {
    uVar1 = Instruction::NumInOperands(func_call_inst);
    if (uVar1 <= index) break;
    this_00 = Instruction::GetInOperand(func_call_inst,index);
    if (this_00->type == SPV_OPERAND_TYPE_ID) {
      this_01 = Pass::get_def_use_mgr(&this->super_Pass);
      uVar1 = Operand::AsId(this_00);
      operand_inst = analysis::DefUseManager::GetDef(this_01,uVar1);
      if (operand_inst->opcode_ == OpAccessChain) {
        local_5c = ReplaceAccessChainFuncCallArguments(this,func_call_inst,operand_inst);
        init_list._M_len = 1;
        init_list._M_array = &local_5c;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
        Instruction::SetInOperand(func_call_inst,index,&local_58);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
        bVar2 = true;
      }
    }
    index = index + 1;
  }
  if (bVar2) {
    IRContext::UpdateDefUse((this->super_Pass).context_,func_call_inst);
  }
  return bVar2;
}

Assistant:

bool FixFuncCallArgumentsPass::FixFuncCallArguments(
    Instruction* func_call_inst) {
  bool modified = false;
  for (uint32_t i = 0; i < func_call_inst->NumInOperands(); ++i) {
    Operand& op = func_call_inst->GetInOperand(i);
    if (op.type != SPV_OPERAND_TYPE_ID) continue;
    Instruction* operand_inst = get_def_use_mgr()->GetDef(op.AsId());
    if (operand_inst->opcode() == spv::Op::OpAccessChain) {
      uint32_t var_id =
          ReplaceAccessChainFuncCallArguments(func_call_inst, operand_inst);
      func_call_inst->SetInOperand(i, {var_id});
      modified = true;
    }
  }
  if (modified) {
    context()->UpdateDefUse(func_call_inst);
  }
  return modified;
}